

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

DecodePsbtLockingScriptStruct * __thiscall
cfd::js::api::json::DecodePsbtLockingScript::ConvertToStruct
          (DecodePsbtLockingScriptStruct *__return_storage_ptr__,DecodePsbtLockingScript *this)

{
  DecodePsbtLockingScript *this_local;
  DecodePsbtLockingScriptStruct *result;
  
  DecodePsbtLockingScriptStruct::DecodePsbtLockingScriptStruct(__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&this->asm__);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->hex,(string *)&this->hex_);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->type,(string *)&this->type_);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->address,(string *)&this->address_);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->ignore_items,&this->ignore_items);
  return __return_storage_ptr__;
}

Assistant:

DecodePsbtLockingScriptStruct DecodePsbtLockingScript::ConvertToStruct() const {  // NOLINT
  DecodePsbtLockingScriptStruct result;
  result.asm_ = asm__;
  result.hex = hex_;
  result.type = type_;
  result.address = address_;
  result.ignore_items = ignore_items;
  return result;
}